

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scalar_operation.cc
# Opt level: O0

bool __thiscall sptk::ScalarOperation::AddTangentOperation(ScalarOperation *this)

{
  OperationInterface *operation;
  OperationPerformer *this_00;
  long in_RDI;
  
  operation = (OperationInterface *)(in_RDI + 0x10);
  this_00 = (OperationPerformer *)operator_new(0x10);
  operator_new(8);
  anon_unknown.dwarf_5ae6::Tangent::Tangent((Tangent *)this_00);
  anon_unknown.dwarf_5ae6::OperationPerformer::OperationPerformer(this_00,operation);
  std::
  vector<sptk::ScalarOperation::ModuleInterface_*,_std::allocator<sptk::ScalarOperation::ModuleInterface_*>_>
  ::push_back((vector<sptk::ScalarOperation::ModuleInterface_*,_std::allocator<sptk::ScalarOperation::ModuleInterface_*>_>
               *)this_00,(value_type *)operation);
  return true;
}

Assistant:

bool ScalarOperation::AddTangentOperation() {
  modules_.push_back(new OperationPerformer(new Tangent()));
  return true;
}